

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<5,_3,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  int i;
  float afVar2 [2];
  float *pfVar3;
  Vector<float,_3> *pVVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  undefined4 uVar9;
  Type in0;
  Type in1;
  Vector<float,_3> res_1;
  Matrix<float,_2,_3> retVal;
  Matrix<float,_3,_2> res;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    in0.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
    in0.m_data[2] = (evalCtx->coords).m_data[2];
  }
  else {
    in0.m_data[0] = 1.1;
    in0.m_data[1] = 0.1;
    in0.m_data[2] = 0.5;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    afVar2 = *(float (*) [2])(evalCtx->coords).m_data;
  }
  else {
    afVar2[0] = 0.5;
    afVar2[1] = 1.0;
  }
  in1.m_data[0] = afVar2[0];
  in1.m_data[1] = afVar2[1];
  pfVar3 = (float *)&retVal;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  retVal.m_data.m_data[2].m_data[0] = 0.0;
  retVal.m_data.m_data[2].m_data[1] = 0.0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar9 = 0x3f800000;
      if (lVar5 != lVar6) {
        uVar9 = 0;
      }
      pfVar3[lVar6 * 2] = (float)uVar9;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    pfVar3 = pfVar3 + 1;
    bVar8 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar8);
  pfVar3 = (float *)&retVal;
  lVar5 = 0;
  do {
    fVar1 = in1.m_data[lVar5];
    lVar6 = 0;
    do {
      pfVar3[lVar6 * 2] = in0.m_data[lVar6] * fVar1;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    pfVar3 = pfVar3 + 1;
    bVar8 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar8);
  pfVar3 = (float *)&res;
  res.m_data.m_data[0].m_data[0] = 0.0;
  res.m_data.m_data[0].m_data[1] = 0.0;
  res.m_data.m_data[0].m_data[2] = 0.0;
  res.m_data.m_data[1].m_data[0] = 0.0;
  res.m_data.m_data[1].m_data[1] = 0.0;
  res.m_data.m_data[1].m_data[2] = 0.0;
  lVar5 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar9 = 0x3f800000;
      if (lVar5 != lVar7) {
        uVar9 = 0;
      }
      *(undefined4 *)((long)pfVar3 + lVar7) = uVar9;
      lVar7 = lVar7 + 0xc;
    } while (lVar7 == 0xc);
    lVar6 = lVar6 + 1;
    pfVar3 = pfVar3 + 1;
    lVar5 = lVar5 + 0xc;
  } while (lVar6 != 3);
  pVVar4 = (Vector<float,_3> *)&res;
  pfVar3 = (float *)&retVal;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      ((Vector<tcu::Vector<float,_3>,_2> *)pVVar4->m_data)->m_data[0].m_data[lVar6] =
           pfVar3[lVar6 * 2];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    pVVar4 = pVVar4 + 1;
    pfVar3 = pfVar3 + 1;
    bVar8 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar8);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  lVar5 = 0;
  do {
    res_1.m_data[lVar5] = res.m_data.m_data[0].m_data[lVar5] + res.m_data.m_data[1].m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  retVal.m_data.m_data[0].m_data = (float  [2])&evalCtx->color;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 1.4013e-45;
  retVal.m_data.m_data[2].m_data[0] = 2.8026e-45;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[(int)retVal.m_data.m_data[0].m_data[lVar5]] = in1.m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}